

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::wrap_soft(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int times)

{
  ostream *poVar1;
  allocator local_39;
  string local_38 [36];
  int local_14;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfStack_10;
  int times_local;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (0 < times) {
    local_14 = times;
    pfStack_10 = this;
    if (times < 2) {
      std::operator<<((ostream *)this->os_,'\n');
    }
    else {
      poVar1 = (ostream *)this->os_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,(long)times,'\n',&local_39);
      std::operator<<(poVar1,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    this->curCol_ = 0;
    this->curParagraphLines_ = this->curParagraphLines_ + 1;
  }
  return;
}

Assistant:

void wrap_soft(int times = 1) {
        if(times < 1) return;
        if(times > 1) {
            os_ << string_type(size_type(times), '\n');
        } else {
            os_ << '\n';
        }
        curCol_ = 0;
        ++curParagraphLines_;
    }